

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.cpp
# Opt level: O3

ScalarFunction * duckdb::SetBitFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe6c;
  FunctionNullHandling in_stack_fffffffffffffe78;
  allocator_type local_181;
  code *bind_lambda;
  LogicalType local_160;
  vector<duckdb::LogicalType,_true> local_148;
  LogicalType local_130;
  LogicalType local_118 [3];
  BaseScalarFunction local_d0;
  
  LogicalType::LogicalType(local_118,BIT);
  LogicalType::LogicalType(local_118 + 1,INTEGER);
  LogicalType::LogicalType(local_118 + 2,INTEGER);
  __l._M_len = 3;
  __l._M_array = local_118;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_148,__l,
             &local_181);
  LogicalType::LogicalType(&local_160,BIT);
  bind_lambda = SetBitOperation;
  LogicalType::LogicalType(&local_130,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_130;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffe64;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffe6c;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_148,&local_160,(scalar_function_t *)&stack0xfffffffffffffe80,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_fffffffffffffe78,bind_lambda);
  LogicalType::~LogicalType(&local_130);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xfffffffffffffe80,(_Any_data *)&stack0xfffffffffffffe80,
               __destroy_functor);
  LogicalType::~LogicalType(&local_160);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_148);
  lVar1 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_118[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  BaseScalarFunction::SetReturnsError(&local_d0,&in_RDI->super_BaseScalarFunction);
  BaseScalarFunction::~BaseScalarFunction(&local_d0);
  return in_RDI;
}

Assistant:

ScalarFunction SetBitFun::GetFunction() {
	ScalarFunction function({LogicalType::BIT, LogicalType::INTEGER, LogicalType::INTEGER}, LogicalType::BIT,
	                        SetBitOperation);
	BaseScalarFunction::SetReturnsError(function);
	return function;
}